

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsMotorSpeed::ArchiveIN(ChShaftsMotorSpeed *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsMotorSpeed>(marchive);
  ChShaftsMotorBase::ArchiveIN(&this->super_ChShaftsMotorBase,marchive);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->motor_torque;
  local_38._name = "motor_torque";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->f_speed;
  local_38._name = "f_speed";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->rot_offset;
  local_38._name = "rot_offset";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->avoid_angle_drift;
  local_38._name = "avoid_angle_drift";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsMotorSpeed::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsMotorSpeed>();

    // deserialize parent class:
    ChShaftsMotorBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(motor_torque);
    marchive >> CHNVP(f_speed);
    marchive >> CHNVP(rot_offset);
    marchive >> CHNVP(avoid_angle_drift);
}